

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpalette_p.h
# Opt level: O2

void __thiscall QPalettePrivate::Data::Data(Data *this,Data *other)

{
  int iVar1;
  long lVar2;
  int grp;
  long lVar3;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  lVar3 = 8;
  do {
    QBrush::QBrush((QBrush *)
                   ((long)&(this->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                   lVar3));
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x218);
  iVar1 = qt_palette_count + 1;
  this->ser_no = qt_palette_count;
  qt_palette_count = iVar1;
  for (lVar3 = 0; lVar2 = 8, lVar3 != 3; lVar3 = lVar3 + 1) {
    for (; lVar2 != 0xb8; lVar2 = lVar2 + 8) {
      QBrush::operator=((QBrush *)
                        ((long)&(this->super_QSharedData).ref.super_QAtomicInteger<int>.
                                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
                                _M_i + lVar2),
                        (QBrush *)
                        ((long)&(other->super_QSharedData).ref.super_QAtomicInteger<int>.
                                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
                                _M_i + lVar2));
    }
    other = (Data *)&other->field_0xb0;
    this = (Data *)&this->field_0xb0;
  }
  return;
}

Assistant:

Data(const Data &other)
            : QSharedData(other)
        {
            for (int grp = 0; grp < int(QPalette::NColorGroups); grp++) {
                for (int role = 0; role < int(QPalette::NColorRoles); role++)
                    br[grp][role] = other.br[grp][role];
            }
        }